

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O3

PaddedSobolSampler *
pbrt::PaddedSobolSampler::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined4 extraout_var;
  int samplesPerPixel;
  char *pcVar3;
  RandomizeStrategy randomizer;
  string s;
  string local_98;
  FileLoc *local_78;
  string local_70;
  string local_50;
  
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"pixelsamples","");
  iVar2 = ParameterDictionary::GetOneInt(parameters,&local_98,0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (*(char *)(Options + 0x20) == '\x01') {
    iVar2 = *(int *)(Options + 0x1c);
  }
  samplesPerPixel = 1;
  if (*(char *)(Options + 0x2c) == '\0') {
    samplesPerPixel = iVar2;
  }
  local_78 = loc;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"randomization","");
  pcVar3 = "fastowen";
  if (samplesPerPixel < 3) {
    pcVar3 = "cranleypatterson";
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,pcVar3,pcVar3 + (ulong)(samplesPerPixel < 3) * 8 + 8);
  ParameterDictionary::GetOneString(&local_98,parameters,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_98);
  if (iVar2 == 0) {
    randomizer = None;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_98);
    if (iVar2 == 0) {
      randomizer = CranleyPatterson;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_98);
      if (iVar2 == 0) {
        randomizer = PermuteDigits;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_98);
        if (iVar2 == 0) {
          randomizer = FastOwen;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_98);
          randomizer = Owen;
          if (iVar2 != 0) {
            ErrorExit<std::__cxx11::string&>
                      (local_78,"%s: unknown randomization strategy given to PaddedSobolSampler",
                       &local_98);
          }
        }
      }
    }
  }
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,4);
  PaddedSobolSampler((PaddedSobolSampler *)CONCAT44(extraout_var,iVar2),samplesPerPixel,randomizer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return (PaddedSobolSampler *)CONCAT44(extraout_var,iVar2);
}

Assistant:

PaddedSobolSampler *PaddedSobolSampler::Create(const ParameterDictionary &parameters,
                                               const FileLoc *loc, Allocator alloc) {
    int nsamp = parameters.GetOneInt("pixelsamples", 16);
    if (Options->pixelSamples)
        nsamp = *Options->pixelSamples;
    if (Options->quickRender)
        nsamp = 1;

    RandomizeStrategy randomizer;
    std::string s = parameters.GetOneString("randomization",
                                            nsamp <= 2 ? "cranleypatterson" : "fastowen");
    if (s == "none")
        randomizer = RandomizeStrategy::None;
    else if (s == "cranleypatterson")
        randomizer = RandomizeStrategy::CranleyPatterson;
    else if (s == "permutedigits")
        randomizer = RandomizeStrategy::PermuteDigits;
    else if (s == "fastowen")
        randomizer = RandomizeStrategy::FastOwen;
    else if (s == "owen")
        randomizer = RandomizeStrategy::Owen;
    else
        ErrorExit(loc, "%s: unknown randomization strategy given to PaddedSobolSampler",
                  s);

    return alloc.new_object<PaddedSobolSampler>(nsamp, randomizer);
}